

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O1

void SetOptimizationLookBehind(CodeGenGenericContext *ctx,bool allow)

{
  undefined3 in_register_00000031;
  
  ctx->x86LookBehind = allow;
  if (CONCAT31(in_register_00000031,allow) == 0) {
    CodeGenGenericContext::KillUnreadRegisters(ctx);
    ctx->lastInvalidate = (int)((ulong)((long)ctx->x86Op - (long)ctx->x86Base) >> 4) * -0x33333333;
    CodeGenGenericContext::InvalidateState(ctx);
    ctx->genRegUpdate[5] = 0;
  }
  return;
}

Assistant:

void SetOptimizationLookBehind(CodeGenGenericContext &ctx, bool allow)
{
	ctx.x86LookBehind = allow;

#ifdef NULLC_OPTIMIZE_X86
	if(!allow)
	{
		ctx.KillUnreadRegisters();

		ctx.lastInvalidate = unsigned(ctx.x86Op - ctx.x86Base);
		ctx.InvalidateState();

		ctx.genRegUpdate[rESP] = 0;
	}
#endif
}